

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

ostream * operator<<(ostream *out,lexemtype *t)

{
  lexemtype *t_local;
  ostream *out_local;
  
  switch(*t) {
  case null:
  default:
    out_local = out;
    break;
  case OBRA:
    out_local = std::operator<<(out,"Open brace");
    break;
  case CBRA:
    out_local = std::operator<<(out,"Close brace");
    break;
  case OPAR:
    out_local = std::operator<<(out,"Open parenthesis");
    break;
  case CPAR:
    out_local = std::operator<<(out,"Close parenthesis");
    break;
  case SEMICOLON:
    out_local = std::operator<<(out,"Semicolon operator");
    break;
  case INTKW:
    out_local = std::operator<<(out,"Int keyword");
    break;
  case RETURNKW:
    out_local = std::operator<<(out,"Return keyword");
    break;
  case IFKW:
    out_local = std::operator<<(out,"If keyword");
    break;
  case ELSEKW:
    out_local = std::operator<<(out,"Else keyword");
    break;
  case FORKW:
    out_local = std::operator<<(out,"For keyword");
    break;
  case WHILEKW:
    out_local = std::operator<<(out,"While keyword");
    break;
  case IDENTIFIER:
    out_local = std::operator<<(out,"Identifier");
    break;
  case EQUAL:
    out_local = std::operator<<(out,"Equal sign");
    break;
  case INTLITERAL:
    out_local = std::operator<<(out,"Int literal");
    break;
  case LESS:
    out_local = std::operator<<(out,"Less sign");
    break;
  case MORE:
    out_local = std::operator<<(out,"More sign");
    break;
  case PLUS:
    out_local = std::operator<<(out,"Plus sign");
    break;
  case MINUS:
    out_local = std::operator<<(out,"Minus sign");
    break;
  case MULTIPLICATION:
    out_local = std::operator<<(out,"Multiplication sign");
    break;
  case DIVISION:
    out_local = std::operator<<(out,"Division sign");
    break;
  case LOGIC_NEG:
    out_local = std::operator<<(out,"Logic negation sign");
    break;
  case COMMA:
    out_local = std::operator<<(out,"Comma sign");
  }
  return out_local;
}

Assistant:

ostream &operator<<(ostream &out, const lexemtype &t) {
    switch (t) {
        case OBRA:
            return (out << "Open brace");
        case CBRA:
            return (out << "Close brace");
        case OPAR:
            return (out << "Open parenthesis");
        case CPAR:
            return (out << "Close parenthesis");
        case SEMICOLON:
            return (out << "Semicolon operator");
        case INTKW:
            return (out << "Int keyword");
        case RETURNKW:
            return (out << "Return keyword");
        case IFKW:
            return (out << "If keyword");
        case ELSEKW:
            return (out << "Else keyword");
        case IDENTIFIER:
            return (out << "Identifier");
        case INTLITERAL:
            return (out << "Int literal");
        case null:
            break;
        case FORKW:
            return (out << "For keyword");
        case WHILEKW:
            return (out << "While keyword");
        case EQUAL:
            return (out << "Equal sign");
        case LESS:
            return (out << "Less sign");
        case MORE:
            return (out << "More sign");
        case PLUS:
            return (out << "Plus sign");
        case MINUS:
            return (out << "Minus sign");
        case MULTIPLICATION:
            return (out << "Multiplication sign");
        case DIVISION:
            return (out << "Division sign");
        case LOGIC_NEG:
            return (out << "Logic negation sign");
//        case DOUBLEKW:
//            break;
//        case CHARKW:
//            break;
//        case FLOATKW:
//            break;
        case COMMA:
            return (out << "Comma sign");
    }
    return (out);
}